

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_insert.cpp
# Opt level: O2

void __thiscall
duckdb::ExpressionBinder::DoUpdateSetQualifyInLambda
          (ExpressionBinder *this,FunctionExpression *function,string *table_name,
          vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
          *lambda_params)

{
  pointer prVar1;
  pointer pPVar2;
  BaseExpression *this_00;
  type pPVar3;
  ColumnRefExpression *pCVar4;
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var5;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_01
  ;
  pointer prVar6;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar7;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  LambdaExpression *local_90;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_88;
  ExpressionBinder *local_80;
  string *local_78;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_70;
  string error_message;
  vector<std::reference_wrapper<duckdb::ParsedExpression>,_true> column_ref_expressions;
  
  puVar7 = (function->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = puVar7;
  local_80 = this;
  local_78 = table_name;
  for (this_01 = (function->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar7; this_01 = this_01 + 1
      ) {
    pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(this_01);
    if ((pPVar2->super_BaseExpression).expression_class == LAMBDA) {
      this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(this_01)->super_BaseExpression;
      local_90 = BaseExpression::Cast<duckdb::LambdaExpression>(this_00);
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      error_message._M_string_length = 0;
      error_message.field_2._M_local_buf[0] = '\0';
      LambdaExpression::ExtractColumnRefExpressions(&column_ref_expressions,local_90,&error_message)
      ;
      if (error_message._M_string_length == 0) {
        ::std::
        vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::emplace_back<>(&lambda_params->
                          super_vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        );
        prVar1 = column_ref_expressions.
                 super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_70 = this_01;
        for (prVar6 = column_ref_expressions.
                      super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; prVar6 != prVar1;
            prVar6 = prVar6 + 1) {
          pCVar4 = BaseExpression::Cast<duckdb::ColumnRefExpression>
                             (&prVar6->_M_data->super_BaseExpression);
          p_Var5 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                      ::back(lambda_params);
          (*(pCVar4->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
                    (&local_b8,pCVar4);
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::_M_emplace<std::__cxx11::string>(p_Var5,&local_b8);
          ::std::__cxx11::string::~string((string *)local_b8._M_pod_data);
        }
        pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator*(&local_90->expr);
        this_01 = local_70;
        table_name = local_78;
        this = local_80;
        local_a8 = (code *)0x0;
        pcStack_a0 = (code *)0x0;
        local_b8._M_unused._M_object = (void *)0x0;
        local_b8._8_8_ = 0;
        local_b8._M_unused._M_object = operator_new(0x18);
        *(ExpressionBinder **)local_b8._M_unused._0_8_ = this;
        *(string **)((long)local_b8._M_unused._0_8_ + 8) = table_name;
        *(vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
          **)((long)local_b8._M_unused._0_8_ + 0x10) = lambda_params;
        pcStack_a0 = ::std::
                     _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder/statement/bind_insert.cpp:89:66)>
                     ::_M_invoke;
        local_a8 = ::std::
                   _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder/statement/bind_insert.cpp:89:66)>
                   ::_M_manager;
        ParsedExpressionIterator::EnumerateChildren
                  (pPVar3,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                           *)&local_b8);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_b8);
        ::std::
        vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::pop_back(&lambda_params->
                    super_vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  );
      }
      else {
        pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator*(&local_90->lhs);
        local_a8 = (code *)0x0;
        pcStack_a0 = (code *)0x0;
        local_b8._M_unused._M_object = (void *)0x0;
        local_b8._8_8_ = 0;
        local_b8._M_unused._M_object = operator_new(0x18);
        *(ExpressionBinder **)local_b8._M_unused._0_8_ = this;
        *(string **)((long)local_b8._M_unused._0_8_ + 8) = table_name;
        *(vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
          **)((long)local_b8._M_unused._0_8_ + 0x10) = lambda_params;
        pcStack_a0 = ::std::
                     _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder/statement/bind_insert.cpp:72:66)>
                     ::_M_invoke;
        local_a8 = ::std::
                   _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder/statement/bind_insert.cpp:72:66)>
                   ::_M_manager;
        ParsedExpressionIterator::EnumerateChildren
                  (pPVar3,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                           *)&local_b8);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_b8);
        pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator*(&local_90->expr);
        local_a8 = (code *)0x0;
        pcStack_a0 = (code *)0x0;
        local_b8._M_unused._M_object = (void *)0x0;
        local_b8._8_8_ = 0;
        local_b8._M_unused._M_object = operator_new(0x18);
        *(ExpressionBinder **)local_b8._M_unused._0_8_ = this;
        *(string **)((long)local_b8._M_unused._0_8_ + 8) = table_name;
        *(vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
          **)((long)local_b8._M_unused._0_8_ + 0x10) = lambda_params;
        pcStack_a0 = ::std::
                     _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder/statement/bind_insert.cpp:75:67)>
                     ::_M_invoke;
        local_a8 = ::std::
                   _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder/statement/bind_insert.cpp:75:67)>
                   ::_M_manager;
        ParsedExpressionIterator::EnumerateChildren
                  (pPVar3,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                           *)&local_b8);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_b8);
      }
      puVar7 = local_88;
      ::std::
      _Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                       *)&column_ref_expressions);
      ::std::__cxx11::string::~string((string *)&error_message);
    }
    else {
      DoUpdateSetQualify(this,this_01,table_name,lambda_params);
    }
  }
  return;
}

Assistant:

void ExpressionBinder::DoUpdateSetQualifyInLambda(FunctionExpression &function, const string &table_name,
                                                  vector<unordered_set<string>> &lambda_params) {

	for (auto &child : function.children) {
		if (child->GetExpressionClass() != ExpressionClass::LAMBDA) {
			DoUpdateSetQualify(child, table_name, lambda_params);
			continue;
		}

		// Special-handling for LHS lambda parameters.
		// We do not qualify them, and we add them to the lambda_params vector.
		auto &lambda_expr = child->Cast<LambdaExpression>();
		string error_message;
		auto column_ref_expressions = lambda_expr.ExtractColumnRefExpressions(error_message);

		if (!error_message.empty()) {
			// Possibly a JSON function, qualify both LHS and RHS.
			ParsedExpressionIterator::EnumerateChildren(*lambda_expr.lhs, [&](unique_ptr<ParsedExpression> &child) {
				DoUpdateSetQualify(child, table_name, lambda_params);
			});
			ParsedExpressionIterator::EnumerateChildren(*lambda_expr.expr, [&](unique_ptr<ParsedExpression> &child) {
				DoUpdateSetQualify(child, table_name, lambda_params);
			});
			continue;
		}

		// Push the lambda parameter names of this level.
		lambda_params.emplace_back();
		for (const auto &column_ref_expr : column_ref_expressions) {
			const auto &column_ref = column_ref_expr.get().Cast<ColumnRefExpression>();
			lambda_params.back().emplace(column_ref.GetName());
		}

		// Only qualify in the RHS of the expression.
		ParsedExpressionIterator::EnumerateChildren(*lambda_expr.expr, [&](unique_ptr<ParsedExpression> &child) {
			DoUpdateSetQualify(child, table_name, lambda_params);
		});

		lambda_params.pop_back();
	}
}